

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmatrix.cpp
# Opt level: O0

int __thiscall
TPZMatrix<std::complex<long_double>_>::Subst_LForward
          (TPZMatrix<std::complex<long_double>_> *this,TPZFMatrix<std::complex<long_double>_> *B)

{
  longdouble __r;
  TPZBaseMatrix *pTVar1;
  int64_t iVar2;
  long lVar3;
  long lVar4;
  TPZBaseMatrix *in_RSI;
  long *in_RDI;
  char *in_stack_000000a8;
  char *in_stack_000000b0;
  int64_t i;
  complex<long_double> sum;
  int64_t c;
  int64_t r;
  complex<long_double> *__y;
  undefined2 uVar5;
  undefined6 in_stack_fffffffffffffeb2;
  undefined1 local_f8 [32];
  undefined1 local_d8 [32];
  undefined1 local_b8 [32];
  undefined1 local_98 [72];
  long local_50;
  complex<long_double> local_48;
  long local_20;
  long local_18;
  TPZBaseMatrix *local_10;
  
  local_10 = in_RSI;
  iVar2 = TPZBaseMatrix::Rows(in_RSI);
  lVar3 = (**(code **)(*in_RDI + 0x60))();
  if (((iVar2 != lVar3) || ((char)in_RDI[3] == '\0')) || ((char)in_RDI[3] != '\x04')) {
    Error(in_stack_000000b0,in_stack_000000a8);
  }
  local_18 = 0;
  while( true ) {
    lVar3 = local_18;
    lVar4 = (**(code **)(*in_RDI + 0x60))();
    if (lVar4 <= lVar3) break;
    local_20 = 0;
    while( true ) {
      lVar3 = local_20;
      iVar2 = TPZBaseMatrix::Cols(local_10);
      if (iVar2 <= lVar3) break;
      __r = (longdouble)0;
      __y = SUB108(__r,0);
      uVar5 = (undefined2)((unkuint10)__r >> 0x40);
      std::complex<long_double>::complex(&local_48,__r,__r);
      for (local_50 = 0; pTVar1 = local_10, lVar4 = local_18, lVar3 = local_20, local_50 < local_18;
          local_50 = local_50 + 1) {
        (**(code **)(*in_RDI + 0x120))(local_98,in_RDI,local_18,local_50);
        (*(local_10->super_TPZSavable)._vptr_TPZSavable[0x24])(local_b8,local_10,local_50,local_20);
        std::operator*((complex<long_double> *)CONCAT62(in_stack_fffffffffffffeb2,uVar5),__y);
        std::complex<long_double>::operator+=
                  ((complex<long_double> *)CONCAT62(in_stack_fffffffffffffeb2,uVar5),__y);
      }
      (*(local_10->super_TPZSavable)._vptr_TPZSavable[0x24])(local_f8,local_10,local_18,local_20);
      std::operator-((complex<long_double> *)CONCAT62(in_stack_fffffffffffffeb2,uVar5),__y);
      (*(pTVar1->super_TPZSavable)._vptr_TPZSavable[0x23])(pTVar1,lVar4,lVar3,local_d8);
      local_20 = local_20 + 1;
    }
    local_18 = local_18 + 1;
  }
  return 1;
}

Assistant:

int TPZMatrix<TVar>::Subst_LForward( TPZFMatrix<TVar> *B ) const {
	if ( (B->Rows() != Dim()) || !fDecomposed || fDecomposed != ELDLt) {
		Error("TPZMatrix::Subst_LForward incompatible dimensions\n");
	}
    for ( int64_t r = 0; r < Dim(); r++ ) {
        for ( int64_t c = 0; c < B->Cols();  c++ )    {
            // Faz sum = SOMA( A[r,i] * B[i,c] ); i = 0, ..., r-1.
            //
            TVar sum = 0.0;
            for ( int64_t i = 0; i < r; i++ ) sum += GetVal(r, i) * B->GetVal(i, c);
			
            // Faz B[r,c] = (B[r,c] - sum) / A[r,r].
            //
            B->PutVal( r, c, B->GetVal(r, c) - sum );
        }
    }
    return( 1 );
}